

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O2

BoundingBox * Assimp::IFC::GetBoundingBox(Polygon *poly)

{
  IntPoint *point;
  pointer pIVar1;
  BoundingBox *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  dVar2 = -10000000000.0;
  dVar3 = -10000000000.0;
  dVar4 = 10000000000.0;
  dVar5 = 10000000000.0;
  for (pIVar1 = (poly->
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pIVar1 != (poly->
                super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                _M_impl.super__Vector_impl_data._M_finish; pIVar1 = pIVar1 + 1) {
    auVar8._0_8_ = (double)pIVar1->X;
    auVar8._8_8_ = (double)pIVar1->Y;
    auVar7 = divpd(auVar8,_DAT_0066fba0);
    auVar7 = maxpd(ZEXT816(0),auVar7);
    auVar8 = minpd(_DAT_00639a00,auVar7);
    auVar6._8_8_ = dVar5;
    auVar6._0_8_ = dVar4;
    auVar6 = minpd(auVar8,auVar6);
    auVar7._8_8_ = dVar3;
    auVar7._0_8_ = dVar2;
    auVar7 = maxpd(auVar8,auVar7);
    dVar4 = auVar6._0_8_;
    dVar5 = auVar6._8_8_;
    dVar2 = auVar7._0_8_;
    dVar3 = auVar7._8_8_;
  }
  (in_RDI->first).x = dVar4;
  (in_RDI->first).y = dVar5;
  (in_RDI->second).x = dVar2;
  (in_RDI->second).y = dVar3;
  return in_RDI;
}

Assistant:

BoundingBox GetBoundingBox(const ClipperLib::Polygon& poly)
{
    IfcVector2 newbb_min, newbb_max;
    MinMaxChooser<IfcVector2>()(newbb_min, newbb_max);

    for(const ClipperLib::IntPoint& point : poly) {
        IfcVector2 vv = IfcVector2( from_int64(point.X), from_int64(point.Y));

        // sanity rounding
        vv = std::max(vv,IfcVector2());
        vv = std::min(vv,one_vec);

        newbb_min = std::min(newbb_min,vv);
        newbb_max = std::max(newbb_max,vv);
    }
    return BoundingBox(newbb_min, newbb_max);
}